

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

TClientInfos * __thiscall GGSock::FileServer::getClientInfos(FileServer *this)

{
  map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  *in_RDI;
  lock_guard<std::mutex> lock;
  TClientInfos *result;
  map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  *this_00;
  
  this_00 = in_RDI;
  std::
  map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  ::map((map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
         *)0x135f7e);
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x135f88);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this_00,(mutex_type *)in_RDI);
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x135fa8);
  std::
  map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  ::operator=(this_00,in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x135fc7);
  return this_00;
}

Assistant:

FileServer::TClientInfos FileServer::getClientInfos() const {
    TClientInfos result;

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        result = m_impl->clientInfos;
    }

    return result;
}